

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertion_order_preserving_map.hpp
# Opt level: O3

unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
* __thiscall
duckdb::
InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
::operator[](InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
             *this,string *key)

{
  pointer prVar1;
  _Head_base<0UL,_duckdb::CTEFilterPusher::MaterializedCTEInfo_*,_false> _Var2;
  MaterializedCTEInfo *in_RAX;
  const_iterator cVar3;
  mapped_type *pmVar4;
  reference pvVar5;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CTEFilterPusher::MaterializedCTEInfo_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  cVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->map_idx,key);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_28._M_head_impl = (MaterializedCTEInfo *)0x0;
    insert(this,key,(unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
                     *)&local_28);
    _Var2._M_head_impl = local_28._M_head_impl;
    if (local_28._M_head_impl != (MaterializedCTEInfo *)0x0) {
      prVar1 = ((local_28._M_head_impl)->filters).
               super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (prVar1 != (pointer)0x0) {
        operator_delete(prVar1);
      }
      operator_delete(_Var2._M_head_impl);
    }
  }
  pmVar4 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->map_idx,key);
  pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_true>
           ::operator[](&this->map,*pmVar4);
  return &pvVar5->second;
}

Assistant:

V &operator[](const string &key) {
		if (!contains(key)) {
			auto v = V();
			insert(key, std::move(v));
		}
		return map[map_idx[key]].second;
	}